

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall ddd::DaTrie<false,_true,_true>::DaTrie(DaTrie<false,_true,_true> *this)

{
  reference pvVar1;
  vector<ddd::Bc,_std::allocator<ddd::Bc>_> *in_RDI;
  vector<ddd::Bc,_std::allocator<ddd::Bc>_> *blocks;
  vector<ddd::Bc,_std::allocator<ddd::Bc>_> *pvVar2;
  DaTrie<false,_true,_true> *this_00;
  
  pvVar2 = in_RDI;
  std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::vector
            ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)0x171dc0);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x171dd3);
  this_00 = (DaTrie<false,_true,_true> *)(pvVar2 + 2);
  std::vector<ddd::Block,_std::allocator<ddd::Block>_>::vector
            ((vector<ddd::Block,_std::allocator<ddd::Block>_> *)0x171de6);
  blocks = pvVar2 + 3;
  std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::vector
            ((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)0x171df9);
  *(undefined4 *)
   &pvVar2[4].super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.super__Vector_impl_data.
    _M_start = 0xffffffff;
  *(undefined4 *)
   ((long)&pvVar2[4].super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  *(undefined4 *)
   &pvVar2[4].super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.super__Vector_impl_data.
    _M_finish = 0;
  fix_(this_00,(uint32_t)((ulong)pvVar2 >> 0x20),
       (vector<ddd::Block,_std::allocator<ddd::Block>_> *)blocks);
  pvVar1 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,0);
  Bc::set_base(pvVar1,0x7fffffff);
  pvVar1 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,0);
  Bc::set_check(pvVar1,0x7fffffff);
  return;
}

Assistant:

DaTrie() {
    if (Prefix) {
      fix_(ROOT_POS, blocks_);
      bc_[ROOT_POS].set_base(INVALID_VALUE);
      bc_[ROOT_POS].set_check(INVALID_VALUE);
    }
  }